

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O2

string_view __thiscall
absl::cord_internal::CordRepBtreeReader::Seek(CordRepBtreeReader *this,size_t offset)

{
  size_t sVar1;
  Position PVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  string_view local_30;
  
  PVar2 = CordRepBtreeNavigator::Seek(&this->navigator_,offset);
  if (PVar2.edge == (CordRep *)0x0) {
    sVar1 = 0;
    bVar3 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  }
  else {
    local_30 = EdgeData(PVar2.edge);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_30,PVar2.offset,0xffffffffffffffff);
    sVar1 = length(this);
    sVar1 = sVar1 - (offset + bVar3._M_len);
  }
  this->remaining_ = sVar1;
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Seek(size_t offset) {
  const CordRepBtreeNavigator::Position pos = navigator_.Seek(offset);
  if (ABSL_PREDICT_FALSE(pos.edge == nullptr)) {
    remaining_ = 0;
    return {};
  }
  absl::string_view chunk = EdgeData(pos.edge).substr(pos.offset);
  remaining_ = length() - offset - chunk.length();
  return chunk;
}